

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::move(QWidget *this,QPoint *p)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTLWExtra *pQVar4;
  pointer pQVar5;
  QWidget *in_RDI;
  bool in_stack_00000017;
  int in_stack_00000018;
  int in_stack_0000001c;
  undefined4 in_stack_00000020;
  WidgetAttribute in_stack_00000024;
  QWidget *in_stack_00000028;
  QWidgetPrivate *d;
  int in_stack_00000138;
  int in_stack_0000013c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  WidgetAttribute in_stack_ffffffffffffffc4;
  QWidget *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  d_func((QWidget *)0x375041);
  setAttribute(in_stack_00000028,in_stack_00000024,in_stack_00000020._3_1_);
  bVar1 = testAttribute(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  if (bVar1) {
    bVar1 = isWindow((QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (bVar1) {
      pQVar4 = QWidgetPrivate::topData
                         ((QWidgetPrivate *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      *(ushort *)&pQVar4->field_0xe0 = *(ushort *)&pQVar4->field_0xe0 & 0xfeff;
    }
    iVar2 = QPoint::x((QPoint *)0x3750b7);
    geometry(in_RDI);
    iVar3 = QRect::x((QRect *)0x3750cc);
    iVar2 = iVar2 + iVar3;
    iVar3 = x((QWidget *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    iVar2 = iVar2 - iVar3;
    in_stack_ffffffffffffffc0 = QPoint::y((QPoint *)0x3750f7);
    geometry(in_RDI);
    iVar3 = QRect::y((QRect *)0x37510d);
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc0 + iVar3;
    y((QWidget *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    width((QWidget *)0x375139);
    height((QWidget *)0x375147);
    QWidgetPrivate::setGeometry_sys
              ((QWidgetPrivate *)CONCAT44(in_stack_00000024,in_stack_00000020),in_stack_0000001c,
               in_stack_00000018,in_stack_0000013c,in_stack_00000138,in_stack_00000017);
    QWidgetPrivate::setDirtyOpaqueRegion
              ((QWidgetPrivate *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
  }
  else {
    bVar1 = isWindow((QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (bVar1) {
      pQVar4 = QWidgetPrivate::topData
                         ((QWidgetPrivate *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      *(ushort *)&pQVar4->field_0xe0 = *(ushort *)&pQVar4->field_0xe0 & 0xfeff | 0x100;
    }
    QRect::moveTopLeft((QRect *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (QPoint *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    setAttribute(in_stack_00000028,in_stack_00000024,in_stack_00000020._3_1_);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3751dd);
  if ((bVar1) &&
     (pQVar5 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3751f1),
     (*(ushort *)&pQVar5->field_0x7c >> 8 & 1) != 0)) {
    QWindowContainer::parentWasMoved
              ((QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

void QWidget::move(const QPoint &p)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_Moved);
    if (testAttribute(Qt::WA_WState_Created)) {
        if (isWindow())
            d->topData()->posIncludesFrame = false;
        d->setGeometry_sys(p.x() + geometry().x() - QWidget::x(),
                       p.y() + geometry().y() - QWidget::y(),
                       width(), height(), true);
        d->setDirtyOpaqueRegion();
    } else {
        // no frame yet: see also QWidgetPrivate::fixPosIncludesFrame(), QWindowPrivate::PositionPolicy.
        if (isWindow())
            d->topData()->posIncludesFrame = true;
        data->crect.moveTopLeft(p); // no frame yet
        setAttribute(Qt::WA_PendingMoveEvent);
    }

    if (d->extra && d->extra->hasWindowContainer)
        QWindowContainer::parentWasMoved(this);
}